

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

mp_int * BinarySource_get_mp_ssh1(BinarySource *src)

{
  uint uVar1;
  mp_int *pmVar2;
  size_t sVar3;
  ptrlen bytes;
  
  uVar1 = BinarySource_get_uint16(src->binarysource_);
  bytes = BinarySource_get_data(src->binarysource_,(ulong)(uVar1 + 7 >> 3));
  if (src->binarysource_->err == BSE_NO_ERROR) {
    pmVar2 = mp_from_bytes_int(bytes,0xffffffffffffffff,bytes.len - 1);
    sVar3 = mp_get_nbits(pmVar2);
    if (sVar3 <= uVar1) {
      return pmVar2;
    }
    src->err = BSE_INVALID;
    mp_free(pmVar2);
  }
  pmVar2 = mp_from_integer(0);
  return pmVar2;
}

Assistant:

mp_int *BinarySource_get_mp_ssh1(BinarySource *src)
{
    unsigned bitc = get_uint16(src);
    ptrlen bytes = get_data(src, (bitc + 7) / 8);
    if (get_err(src)) {
        return mp_from_integer(0);
    } else {
        mp_int *toret = mp_from_bytes_be(bytes);
        /* SSH-1.5 spec says that it's OK for the prefix uint16 to be
         * _greater_ than the actual number of bits */
        if (mp_get_nbits(toret) > bitc) {
            src->err = BSE_INVALID;
            mp_free(toret);
            toret = mp_from_integer(0);
        }
        return toret;
    }
}